

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::
     ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
               (CodedInputStream *input,float *value)

{
  float *pfVar1;
  bool bVar2;
  float local_c;
  
  pfVar1 = (float *)input->buffer_;
  if (*(int *)&input->buffer_end_ - (int)pfVar1 < 4) {
    bVar2 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_c);
    if (!bVar2) {
      return false;
    }
  }
  else {
    local_c = *pfVar1;
    input->buffer_ = (uint8 *)(pfVar1 + 1);
  }
  *value = local_c;
  return true;
}

Assistant:

inline bool WireFormatLite::ReadPrimitive<float, WireFormatLite::TYPE_FLOAT>(
    io::CodedInputStream* input,
    float* value) {
  uint32 temp;
  if (!input->ReadLittleEndian32(&temp)) return false;
  *value = DecodeFloat(temp);
  return true;
}